

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_executor.cpp
# Opt level: O1

void __thiscall
duckdb::WindowExecutor::WindowExecutor
          (WindowExecutor *this,BoundWindowExpression *wexpr,ClientContext *context,
          WindowSharedExpressions *shared)

{
  reference pvVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  column_t cVar3;
  
  this->_vptr_WindowExecutor = (_func_int **)&PTR__WindowExecutor_024aceb8;
  this->wexpr = wexpr;
  this->context = context;
  *(undefined4 *)&this->boundary_start_idx = 0xffffffff;
  *(undefined4 *)((long)&this->boundary_start_idx + 4) = 0xffffffff;
  *(undefined4 *)&this->boundary_end_idx = 0xffffffff;
  *(undefined4 *)((long)&this->boundary_end_idx + 4) = 0xffffffff;
  if ((wexpr->end == EXPR_PRECEDING_RANGE || wexpr->start == EXPR_PRECEDING_RANGE) ||
     (wexpr->end == EXPR_FOLLOWING_RANGE || wexpr->start == EXPR_FOLLOWING_RANGE)) {
    pvVar1 = vector<duckdb::BoundOrderByNode,_true>::operator[](&wexpr->orders,0);
    _Var2._M_head_impl =
         (pvVar1->expression).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  }
  else {
    _Var2._M_head_impl = (Expression *)0x0;
  }
  (this->range_expr).ptr = _Var2._M_head_impl;
  this->range_idx = 0xffffffffffffffff;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    pvVar1 = vector<duckdb::BoundOrderByNode,_true>::operator[](&wexpr->orders,0);
    cVar3 = WindowSharedExpressions::RegisterExpr(&pvVar1->expression,&shared->coll_shared);
    this->range_idx = cVar3;
  }
  cVar3 = WindowSharedExpressions::RegisterExpr(&wexpr->start_expr,&shared->eval_shared);
  this->boundary_start_idx = cVar3;
  cVar3 = WindowSharedExpressions::RegisterExpr(&wexpr->end_expr,&shared->eval_shared);
  this->boundary_end_idx = cVar3;
  return;
}

Assistant:

WindowExecutor::WindowExecutor(BoundWindowExpression &wexpr, ClientContext &context, WindowSharedExpressions &shared)
    : wexpr(wexpr), context(context),
      range_expr((WindowBoundariesState::HasPrecedingRange(wexpr) || WindowBoundariesState::HasFollowingRange(wexpr))
                     ? wexpr.orders[0].expression.get()
                     : nullptr) {
	if (range_expr) {
		range_idx = shared.RegisterCollection(wexpr.orders[0].expression, false);
	}

	boundary_start_idx = shared.RegisterEvaluate(wexpr.start_expr);
	boundary_end_idx = shared.RegisterEvaluate(wexpr.end_expr);
}